

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O2

void __thiscall
wasm::SExpressionWasmBuilder::parseTag(SExpressionWasmBuilder *this,Element *s,bool preParseImport)

{
  char *pcVar1;
  _Head_base<0UL,_wasm::Tag_*,_false> _Var2;
  __single_object curr;
  bool bVar3;
  Element *pEVar4;
  Tag *pTVar5;
  size_t sVar6;
  Element *pEVar7;
  Export *pEVar8;
  size_t sVar9;
  string *psVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  IString str;
  string_view sVar11;
  IString IVar12;
  Signature SVar13;
  ulong uStack_180;
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  undefined8 local_58;
  undefined8 uStack_50;
  _Head_base<0UL,_wasm::Tag_*,_false> local_48;
  __single_object tag;
  HeapType tagType;
  
  std::make_unique<wasm::Tag>();
  pEVar4 = Element::operator[](s,1);
  if (pEVar4->isList_ == false) {
    pEVar4 = Element::operator[](s,1);
    if ((pEVar4->isList_ != false) || ((pEVar4->dollared_ & 1U) == 0)) goto LAB_00a11a86;
    pEVar4 = Element::operator[](s,1);
    _Var2._M_head_impl = local_48._M_head_impl;
    sVar11 = (string_view)Element::str(pEVar4);
    ((_Var2._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar11;
    ((_Var2._M_head_impl)->super_Importable).super_Named.hasExplicitName = true;
    pTVar5 = Module::getTagOrNull
                       (this->wasm,
                        (Name)((local_48._M_head_impl)->super_Importable).super_Named.name.
                              super_IString.str);
    if (pTVar5 != (Tag *)0x0) {
      psVar10 = (string *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string<std::allocator<char>>
                (local_178,"duplicate tag",(allocator<char> *)&tag);
      local_58 = pEVar4->line;
      uStack_50 = pEVar4->col;
      std::__cxx11::string::string(psVar10,local_178);
      *(undefined4 *)(psVar10 + 0x20) = (undefined4)local_58;
      *(undefined4 *)(psVar10 + 0x24) = local_58._4_4_;
      *(undefined4 *)(psVar10 + 0x28) = (undefined4)uStack_50;
      *(undefined4 *)(psVar10 + 0x2c) = uStack_50._4_4_;
      __cxa_throw(psVar10,&ParseException::typeinfo,ParseException::~ParseException);
    }
    uStack_180 = 2;
  }
  else {
LAB_00a11a86:
    sVar11 = (string_view)Name::fromInt((long)this->tagCounter);
    ((local_48._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar11;
    pTVar5 = Module::getTagOrNull(this->wasm,(Name)sVar11);
    if (pTVar5 != (Tag *)0x0) {
      __assert_fail("!wasm.getTagOrNull(tag->name)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-s-parser.cpp"
                    ,0xf78,"void wasm::SExpressionWasmBuilder::parseTag(Element &, bool)");
    }
    uStack_180 = 1;
  }
  this->tagCounter = this->tagCounter + 1;
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
            (&this->tagNames,(value_type *)local_48._M_head_impl);
  sVar6 = Element::size(s);
  if (uStack_180 < sVar6) {
    pEVar4 = Element::operator[](s,(uint)uStack_180);
    IVar12.str._M_str = extraout_RDX;
    IVar12.str._M_len = IMPORT._8_8_;
    bVar3 = elementStartsWith(pEVar4,IVar12);
    if (bVar3) {
      if (!preParseImport) {
        __assert_fail("preParseImport && \"import element in non-preParseImport mode\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-s-parser.cpp"
                      ,0xf7f,"void wasm::SExpressionWasmBuilder::parseTag(Element &, bool)");
      }
      pEVar4 = Element::operator[](s,(uint)uStack_180);
      sVar6 = Element::size(pEVar4);
      if (sVar6 != 3) {
        psVar10 = (string *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_158,"invalid import",(allocator<char> *)&tag);
        local_58 = pEVar4->line;
        uStack_50 = pEVar4->col;
        std::__cxx11::string::string(psVar10,local_158);
        *(undefined4 *)(psVar10 + 0x20) = (undefined4)local_58;
        *(undefined4 *)(psVar10 + 0x24) = local_58._4_4_;
        *(undefined4 *)(psVar10 + 0x28) = (undefined4)uStack_50;
        *(undefined4 *)(psVar10 + 0x2c) = uStack_50._4_4_;
        __cxa_throw(psVar10,&ParseException::typeinfo,ParseException::~ParseException);
      }
      pEVar7 = Element::operator[](pEVar4,1);
      if (pEVar7->isList_ != false) {
LAB_00a11e1f:
        psVar10 = (string *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_138,"invalid import module name",(allocator<char> *)&tag);
        pEVar7 = Element::operator[](pEVar4,1);
        sVar6 = pEVar7->line;
        pEVar4 = Element::operator[](pEVar4,1);
        sVar9 = pEVar4->col;
        std::__cxx11::string::string(psVar10,local_138);
        *(size_t *)(psVar10 + 0x20) = sVar6;
        *(size_t *)(psVar10 + 0x28) = sVar9;
        __cxa_throw(psVar10,&ParseException::typeinfo,ParseException::~ParseException);
      }
      pEVar7 = Element::operator[](pEVar4,1);
      if ((pEVar7->isList_ == false) && ((pEVar7->dollared_ & 1U) != 0)) goto LAB_00a11e1f;
      pEVar7 = Element::operator[](pEVar4,2);
      if (pEVar7->isList_ != false) {
LAB_00a11e97:
        psVar10 = (string *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_118,"invalid import base name",(allocator<char> *)&tag);
        pEVar7 = Element::operator[](pEVar4,2);
        sVar6 = pEVar7->line;
        pEVar4 = Element::operator[](pEVar4,2);
        sVar9 = pEVar4->col;
        std::__cxx11::string::string(psVar10,local_118);
        *(size_t *)(psVar10 + 0x20) = sVar6;
        *(size_t *)(psVar10 + 0x28) = sVar9;
        __cxa_throw(psVar10,&ParseException::typeinfo,ParseException::~ParseException);
      }
      pEVar7 = Element::operator[](pEVar4,2);
      if ((pEVar7->isList_ == false) && ((pEVar7->dollared_ & 1U) != 0)) goto LAB_00a11e97;
      pEVar7 = Element::operator[](pEVar4,1);
      sVar11 = (string_view)Element::str(pEVar7);
      ((local_48._M_head_impl)->super_Importable).module.super_IString.str = sVar11;
      pEVar4 = Element::operator[](pEVar4,2);
      sVar11 = (string_view)Element::str(pEVar4);
      uStack_180 = uStack_180 + 1;
      ((local_48._M_head_impl)->super_Importable).base.super_IString.str = sVar11;
    }
  }
  sVar6 = Element::size(s);
  if (uStack_180 < sVar6) {
    pEVar4 = Element::operator[](s,(uint)uStack_180);
    str.str._M_str = extraout_RDX_00;
    str.str._M_len = EXPORT._8_8_;
    bVar3 = elementStartsWith(pEVar4,str);
    if (bVar3) {
      pEVar4 = Element::operator[](s,(uint)uStack_180);
      if (((local_48._M_head_impl)->super_Importable).module.super_IString.str._M_str != (char *)0x0
         ) {
        psVar10 = (string *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_f8,"import and export cannot be specified together",(allocator<char> *)&tag
                  );
        local_58 = pEVar4->line;
        uStack_50 = pEVar4->col;
        std::__cxx11::string::string(psVar10,local_f8);
        *(undefined4 *)(psVar10 + 0x20) = (undefined4)local_58;
        *(undefined4 *)(psVar10 + 0x24) = local_58._4_4_;
        *(undefined4 *)(psVar10 + 0x28) = (undefined4)uStack_50;
        *(undefined4 *)(psVar10 + 0x2c) = uStack_50._4_4_;
        __cxa_throw(psVar10,&ParseException::typeinfo,ParseException::~ParseException);
      }
      sVar6 = Element::size(pEVar4);
      if (sVar6 != 2) {
        psVar10 = (string *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_d8,"invalid export",(allocator<char> *)&tag);
        local_58 = pEVar4->line;
        uStack_50 = pEVar4->col;
        std::__cxx11::string::string(psVar10,local_d8);
        *(undefined4 *)(psVar10 + 0x20) = (undefined4)local_58;
        *(undefined4 *)(psVar10 + 0x24) = local_58._4_4_;
        *(undefined4 *)(psVar10 + 0x28) = (undefined4)uStack_50;
        *(undefined4 *)(psVar10 + 0x2c) = uStack_50._4_4_;
        __cxa_throw(psVar10,&ParseException::typeinfo,ParseException::~ParseException);
      }
      pEVar7 = Element::operator[](pEVar4,1);
      if (pEVar7->isList_ == false) {
        pEVar7 = Element::operator[](pEVar4,1);
        if ((pEVar7->isList_ != false) || ((pEVar7->dollared_ & 1U) == 0)) {
          std::make_unique<wasm::Export>();
          pEVar7 = Element::operator[](pEVar4,1);
          IVar12 = Element::str(pEVar7);
          *(string_view *)
           tag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
           super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl = IVar12.str;
          pEVar8 = Module::getExportOrNull(this->wasm,(Name)IVar12.str);
          curr = tag;
          if (pEVar8 != (Export *)0x0) {
            psVar10 = (string *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_98,"duplicate export",(allocator<char> *)((long)&tagType.id + 7));
            pEVar7 = Element::operator[](pEVar4,1);
            sVar6 = pEVar7->line;
            pEVar4 = Element::operator[](pEVar4,1);
            sVar9 = pEVar4->col;
            std::__cxx11::string::string(psVar10,local_98);
            *(size_t *)(psVar10 + 0x20) = sVar6;
            *(size_t *)(psVar10 + 0x28) = sVar9;
            __cxa_throw(psVar10,&ParseException::typeinfo,ParseException::~ParseException);
          }
          pcVar1 = ((local_48._M_head_impl)->super_Importable).super_Named.name.super_IString.str.
                   _M_str;
          *(size_t *)
           ((long)tag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                  super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x10) =
               ((local_48._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len
          ;
          *(char **)((long)tag._M_t.
                           super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
                           super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                           super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x18) = pcVar1;
          *(undefined4 *)
           ((long)tag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                  super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x20) = 4;
          tag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
          super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl =
               (__uniq_ptr_data<wasm::Tag,_std::default_delete<wasm::Tag>,_true,_true>)
               (__uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>)0x0;
          Module::addExport(this->wasm,
                            (Export *)
                            curr._M_t.
                            super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
                            super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                            super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl);
          uStack_180 = uStack_180 + 1;
          std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
                    ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)&tag);
          goto LAB_00a11d24;
        }
      }
      psVar10 = (string *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string<std::allocator<char>>
                (local_b8,"invalid export name",(allocator<char> *)&tag);
      pEVar7 = Element::operator[](pEVar4,1);
      sVar6 = pEVar7->line;
      pEVar4 = Element::operator[](pEVar4,1);
      sVar9 = pEVar4->col;
      std::__cxx11::string::string(psVar10,local_b8);
      *(size_t *)(psVar10 + 0x20) = sVar6;
      *(size_t *)(psVar10 + 0x28) = sVar9;
      __cxa_throw(psVar10,&ParseException::typeinfo,ParseException::~ParseException);
    }
  }
LAB_00a11d24:
  tag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
  super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Tag,_std::default_delete<wasm::Tag>,_true,_true>)
       (__uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>)0x1;
  sVar6 = parseTypeUse(this,s,uStack_180,(HeapType *)&tag);
  SVar13 = HeapType::getSignature((HeapType *)&tag);
  (local_48._M_head_impl)->sig = SVar13;
  sVar9 = Element::size(s);
  _Var2._M_head_impl = local_48._M_head_impl;
  if (sVar9 <= sVar6) {
    local_48._M_head_impl = (Tag *)0x0;
    Module::addTag(this->wasm,_Var2._M_head_impl);
    std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr
              ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&local_48);
    return;
  }
  psVar10 = (string *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"invalid element",(allocator<char> *)((long)&tagType.id + 7));
  pEVar4 = Element::operator[](s,(uint)sVar6);
  sVar9 = pEVar4->line;
  pEVar4 = Element::operator[](s,(uint)sVar6);
  sVar6 = pEVar4->col;
  std::__cxx11::string::string(psVar10,local_78);
  *(size_t *)(psVar10 + 0x20) = sVar9;
  *(size_t *)(psVar10 + 0x28) = sVar6;
  __cxa_throw(psVar10,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

void SExpressionWasmBuilder::parseTag(Element& s, bool preParseImport) {
  auto tag = std::make_unique<Tag>();
  size_t i = 1;

  // Parse name
  if (s[i]->isStr() && s[i]->dollared()) {
    auto& inner = *s[i++];
    tag->setExplicitName(inner.str());
    if (wasm.getTagOrNull(tag->name)) {
      throw ParseException("duplicate tag", inner.line, inner.col);
    }
  } else {
    tag->name = Name::fromInt(tagCounter);
    assert(!wasm.getTagOrNull(tag->name));
  }
  tagCounter++;
  tagNames.push_back(tag->name);

  // Parse import, if any
  if (i < s.size() && elementStartsWith(*s[i], IMPORT)) {
    assert(preParseImport && "import element in non-preParseImport mode");
    auto& importElem = *s[i++];
    if (importElem.size() != 3) {
      throw ParseException("invalid import", importElem.line, importElem.col);
    }
    if (!importElem[1]->isStr() || importElem[1]->dollared()) {
      throw ParseException(
        "invalid import module name", importElem[1]->line, importElem[1]->col);
    }
    if (!importElem[2]->isStr() || importElem[2]->dollared()) {
      throw ParseException(
        "invalid import base name", importElem[2]->line, importElem[2]->col);
    }
    tag->module = importElem[1]->str();
    tag->base = importElem[2]->str();
  }

  // Parse export, if any
  if (i < s.size() && elementStartsWith(*s[i], EXPORT)) {
    auto& exportElem = *s[i++];
    if (tag->module.is()) {
      throw ParseException("import and export cannot be specified together",
                           exportElem.line,
                           exportElem.col);
    }
    if (exportElem.size() != 2) {
      throw ParseException("invalid export", exportElem.line, exportElem.col);
    }
    if (!exportElem[1]->isStr() || exportElem[1]->dollared()) {
      throw ParseException(
        "invalid export name", exportElem[1]->line, exportElem[1]->col);
    }
    auto ex = std::make_unique<Export>();
    ex->name = exportElem[1]->str();
    if (wasm.getExportOrNull(ex->name)) {
      throw ParseException(
        "duplicate export", exportElem[1]->line, exportElem[1]->col);
    }
    ex->value = tag->name;
    ex->kind = ExternalKind::Tag;
    wasm.addExport(ex.release());
  }

  // Parse typeuse
  HeapType tagType;
  i = parseTypeUse(s, i, tagType);
  tag->sig = tagType.getSignature();

  // If there are more elements, they are invalid
  if (i < s.size()) {
    throw ParseException("invalid element", s[i]->line, s[i]->col);
  }

  wasm.addTag(tag.release());
}